

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UnicodeString *src,int32_t srcStart,int32_t srcLength)

{
  short sVar1;
  UnicodeString *pUVar2;
  int iVar3;
  int32_t srcLength_00;
  int srcStart_00;
  
  if (srcLength == 0) {
    return this;
  }
  sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (src->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  srcStart_00 = srcStart;
  if (iVar3 < srcStart) {
    srcStart_00 = iVar3;
  }
  if (srcStart < 0) {
    srcStart_00 = 0;
  }
  srcLength_00 = iVar3 - srcStart_00;
  if (srcLength <= iVar3 - srcStart_00) {
    srcLength_00 = srcLength;
  }
  if (srcLength < 0) {
    srcLength_00 = 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pUVar2 = doAppend(this,(src->fUnion).fFields.fArray,srcStart_00,srcLength_00);
    return pUVar2;
  }
  pUVar2 = doAppend(this,(src->fUnion).fStackFields.fBuffer,srcStart_00,srcLength_00);
  return pUVar2;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UnicodeString& src, int32_t srcStart, int32_t srcLength) {
  if(srcLength == 0) {
    return *this;
  }

  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);
  return doAppend(src.getArrayStart(), srcStart, srcLength);
}